

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O2

void writeTiledRgbaMIP1(char *fileName,int width,int height,int tileWidth,int tileHeight)

{
  int iVar1;
  int iVar2;
  int xMax;
  int yMax;
  undefined8 uVar3;
  int level;
  int xLevel;
  int iVar4;
  Array2D<Imf_3_2::Rgba> pixels;
  TiledRgbaOutputFile out;
  undefined8 local_38;
  
  local_38 = 0;
  uVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)0x3f800000,0x3f800000,&out,fileName,width,height,tileWidth,
             tileHeight,1,0,0xf,&local_38,0,3,uVar3);
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D(&pixels,(long)height,(long)width);
  Imf_3_2::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pixels._data,1);
  xLevel = 0;
  while( true ) {
    iVar1 = Imf_3_2::TiledRgbaOutputFile::numLevels();
    if (iVar1 <= xLevel) break;
    iVar4 = (int)&out;
    iVar1 = Imf_3_2::TiledRgbaOutputFile::levelWidth(iVar4);
    iVar2 = Imf_3_2::TiledRgbaOutputFile::levelHeight(iVar4);
    xMax = Imf_3_2::TiledRgbaOutputFile::levelWidth(iVar4);
    yMax = Imf_3_2::TiledRgbaOutputFile::levelHeight(iVar4);
    drawImage4(&pixels,iVar1,iVar2,0,xMax,0,yMax,xLevel,xLevel);
    iVar1 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar4);
    iVar2 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar4);
    Imf_3_2::TiledRgbaOutputFile::writeTiles(iVar4,0,iVar1 + -1,0,iVar2 + -1);
    xLevel = xLevel + 1;
  }
  Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(&pixels);
  Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
  return;
}

Assistant:

void
writeTiledRgbaMIP1 (
    const char fileName[], int width, int height, int tileWidth, int tileHeight)
{
    //
    // Write a tiled image with mipmap levels using an image-sized framebuffer.
    //

    TiledRgbaOutputFile out (
        fileName,
        width,
        height, // image size
        tileWidth,
        tileHeight,    // tile size
        MIPMAP_LEVELS, // level mode
        ROUND_DOWN,    // rounding mode
        WRITE_RGBA);   // channels in file

    Array2D<Rgba> pixels (height, width);
    out.setFrameBuffer (&pixels[0][0], 1, width);

    for (int level = 0; level < out.numLevels (); ++level)
    {
        drawImage4 (
            pixels,
            out.levelWidth (level),
            out.levelHeight (level),
            0,
            out.levelWidth (level),
            0,
            out.levelHeight (level),
            level,
            level);

        out.writeTiles (
            0, out.numXTiles (level) - 1, 0, out.numYTiles (level) - 1, level);
    }
}